

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cc
# Opt level: O2

LogStream * __thiscall tt::LogStream::operator<<(LogStream *this,longlong v)

{
  formatInteger<long_long>(this,v);
  return this;
}

Assistant:

LogStream& LogStream::operator<< (long long v){
	formatInteger(v);

	return *this;
}